

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
booster::locale::dgettext<char>(char *domain,char *id,locale *loc)

{
  string *in_RSI;
  basic_message<char> *in_RDI;
  char_type *in_stack_fffffffffffffef8;
  basic_message<char> *this;
  allocator *locale;
  basic_message<char> *in_stack_ffffffffffffff28;
  allocator local_c1;
  string local_c0 [176];
  string *local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  basic_message<char>::basic_message(in_RDI,in_stack_fffffffffffffef8);
  locale = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,(char *)local_10,locale);
  basic_message<char>::str(in_stack_ffffffffffffff28,(locale *)locale,local_10);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  basic_message<char>::~basic_message(this);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI;
}

Assistant:

std::basic_string<CharType>  dgettext(  char const *domain,
                                                CharType const *id,
                                                std::locale const &loc=std::locale())
        {
            return basic_message<CharType>(id).str(loc,domain);
        }